

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O1

bool __thiscall Lexer::ReadEvalString(Lexer *this,EvalString *eval,bool path,string *err)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  byte *pbVar5;
  undefined7 in_register_00000011;
  size_t sVar6;
  byte *pbVar7;
  byte *pbVar8;
  bool bVar9;
  StringPiece text;
  StringPiece text_00;
  StringPiece text_01;
  StringPiece text_02;
  string local_68;
  undefined4 local_44;
  string *local_40;
  ulong local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000011,path);
  local_38 = (ulong)((uint)!path * 2);
  pbVar8 = (byte *)this->ofs_;
  local_40 = err;
  do {
    pbVar7 = pbVar8;
    bVar2 = *pbVar7;
    if ((""[bVar2] & 0x10) == 0) {
      if (bVar2 < 0xe) {
        if (bVar2 == 0) {
          this->last_token_ = (char *)pbVar7;
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"unexpected EOF","");
          Error(this,&local_68,local_40);
        }
        else {
          if (bVar2 < 0xb) goto LAB_001261e6;
          if (pbVar7[1] == 10) {
            iVar4 = 2;
            pbVar8 = pbVar7 + local_38;
            goto LAB_001262ba;
          }
          this->last_token_ = (char *)pbVar7;
          DescribeLastError_abi_cxx11_(&local_68,this);
          Error(this,&local_68,local_40);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pbVar8 = pbVar7 + 1;
      }
      else {
        if (3 < (byte)(bVar2 - 0x21)) {
LAB_001261e6:
          iVar4 = 2;
          pbVar8 = pbVar7;
          if (((char)local_44 == '\0') && (pbVar8 = pbVar7 + 1, pbVar5 = pbVar7, bVar2 != 10))
          goto LAB_00126213;
          goto LAB_001262ba;
        }
        pbVar5 = pbVar7 + 1;
        bVar2 = pbVar7[1];
        if ((""[bVar2] & 0x40) != 0) {
          text_01.len_ = 0;
          pbVar8 = pbVar5;
          do {
            pbVar1 = pbVar8 + 1;
            pbVar8 = pbVar8 + 1;
            text_01.len_ = text_01.len_ + 1;
          } while ((""[*pbVar1] & 0x40) != 0);
          text_01.str_ = (char *)pbVar5;
          EvalString::AddSpecial(eval,text_01);
          goto LAB_0012618f;
        }
        if (0x20 < bVar2) {
          if (bVar2 < 0x30) {
            if (bVar2 != 0x24) goto LAB_00126389;
            pbVar8 = pbVar7 + 2;
            pbVar5 = (byte *)"$";
          }
          else {
            if (0x3a < bVar2) {
              if (((byte)(bVar2 + 0x9f) < 0x1b) && ((char)""[pbVar7[2]] < '\0')) {
                text_01.len_ = 0;
                do {
                  sVar6 = text_01.len_;
                  text_02.len_ = sVar6 + 1;
                  text_01.len_ = text_02.len_;
                } while ((char)""[pbVar7[sVar6 + 3]] < '\0');
                if (pbVar7[sVar6 + 3] == 0x7d) {
                  text_02.str_ = (char *)(pbVar7 + 2);
                  EvalString::AddSpecial(eval,text_02);
                  iVar4 = 3;
                  pbVar8 = pbVar7 + sVar6 + 4;
                  goto LAB_001262ba;
                }
              }
              goto LAB_00126389;
            }
            pbVar8 = pbVar7 + 2;
            pbVar5 = (byte *)0x129645;
          }
LAB_00126213:
          text_00.len_ = 1;
          text_00.str_ = (char *)pbVar5;
          EvalString::AddText(eval,text_00);
          goto LAB_0012618f;
        }
        if (bVar2 < 0xd) {
          if (bVar2 == 10) {
            do {
              pbVar8 = pbVar5 + 1;
              iVar4 = 3;
              pbVar1 = pbVar5 + 1;
              pbVar5 = pbVar8;
            } while (*pbVar1 == 0x20);
            goto LAB_001262ba;
          }
        }
        else if (bVar2 == 0xd) {
          pbVar5 = pbVar7 + 2;
          if (pbVar7[2] == 10) {
            do {
              pbVar8 = pbVar5 + 1;
              iVar4 = 3;
              pbVar1 = pbVar5 + 1;
              pbVar5 = pbVar8;
            } while (*pbVar1 == 0x20);
            goto LAB_001262ba;
          }
        }
        else if (bVar2 == 0x20) {
          pbVar8 = pbVar7 + 2;
          pbVar5 = (byte *)0x128d43;
          goto LAB_00126213;
        }
LAB_00126389:
        pbVar8 = pbVar7 + 2;
        this->last_token_ = (char *)pbVar7;
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"bad $-escape (literal $ must be written as $$)","");
        Error(this,&local_68,local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      iVar4 = 1;
    }
    else {
      text_01.len_ = 0;
      do {
        lVar3 = text_01.len_ + 1;
        text_01.len_ = text_01.len_ + 1;
      } while ((""[pbVar7[lVar3]] & 0x10) != 0);
      text.len_ = text_01.len_;
      text.str_ = (char *)pbVar7;
      EvalString::AddText(eval,text);
      pbVar8 = pbVar7 + text_01.len_;
LAB_0012618f:
      iVar4 = 3;
    }
LAB_001262ba:
    if (iVar4 != 3) {
      if (iVar4 == 2) {
        this->last_token_ = (char *)pbVar7;
        this->ofs_ = (char *)pbVar8;
        bVar9 = true;
        if ((char)local_44 != '\0') {
          EatWhitespace(this);
        }
      }
      else {
        bVar9 = false;
      }
      return bVar9;
    }
  } while( true );
}

Assistant:

bool Lexer::ReadEvalString(EvalString* eval, bool path, string* err) {
  const char* p = ofs_;
  const char* q;
  const char* start;
  for (;;) {
    start = p;
    
{
	unsigned char yych;
	static const unsigned char yybm[] = {
		  0,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,   0,  16,  16,   0,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 32,  16,  16,  16,   0,  16,  16,  16, 
		 16,  16,  16,  16,  16, 208, 144,  16, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208,   0,  16,  16,  16,  16,  16, 
		 16, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208,  16,  16,  16,  16, 208, 
		 16, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208,  16,   0,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
	};
	yych = *p;
	if (yybm[0+yych] & 16) {
		goto yy102;
	}
	if (yych <= '\r') {
		if (yych <= 0x00) goto yy100;
		if (yych <= '\n') goto yy105;
		goto yy107;
	} else {
		if (yych <= ' ') goto yy105;
		if (yych <= '$') goto yy109;
		goto yy105;
	}
yy100:
	++p;
	{
      last_token_ = start;
      return Error("unexpected EOF", err);
    }
yy102:
	yych = *++p;
	if (yybm[0+yych] & 16) {
		goto yy102;
	}
	{
      eval->AddText(StringPiece(start, p - start));
      continue;
    }
yy105:
	++p;
	{
      if (path) {
        p = start;
        break;
      } else {
        if (*start == '\n')
          break;
        eval->AddText(StringPiece(start, 1));
        continue;
      }
    }
yy107:
	yych = *++p;
	if (yych == '\n') goto yy110;
	{
      last_token_ = start;
      return Error(DescribeLastError(), err);
    }
yy109:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy122;
	}
	if (yych <= ' ') {
		if (yych <= '\f') {
			if (yych == '\n') goto yy114;
			goto yy112;
		} else {
			if (yych <= '\r') goto yy117;
			if (yych <= 0x1F) goto yy112;
			goto yy118;
		}
	} else {
		if (yych <= '/') {
			if (yych == '$') goto yy120;
			goto yy112;
		} else {
			if (yych <= ':') goto yy125;
			if (yych <= '`') goto yy112;
			if (yych <= '{') goto yy127;
			goto yy112;
		}
	}
yy110:
	++p;
	{
      if (path)
        p = start;
      break;
    }
yy112:
	++p;
yy113:
	{
      last_token_ = start;
      return Error("bad $-escape (literal $ must be written as $$)", err);
    }
yy114:
	yych = *++p;
	if (yybm[0+yych] & 32) {
		goto yy114;
	}
	{
      continue;
    }
yy117:
	yych = *++p;
	if (yych == '\n') goto yy128;
	goto yy113;
yy118:
	++p;
	{
      eval->AddText(StringPiece(" ", 1));
      continue;
    }
yy120:
	++p;
	{
      eval->AddText(StringPiece("$", 1));
      continue;
    }
yy122:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy122;
	}
	{
      eval->AddSpecial(StringPiece(start + 1, p - start - 1));
      continue;
    }
yy125:
	++p;
	{
      eval->AddText(StringPiece(":", 1));
      continue;
    }
yy127:
	yych = *(q = ++p);
	if (yybm[0+yych] & 128) {
		goto yy131;
	}
	goto yy113;
yy128:
	yych = *++p;
	if (yych == ' ') goto yy128;
	{
      continue;
    }
yy131:
	yych = *++p;
	if (yybm[0+yych] & 128) {
		goto yy131;
	}
	if (yych == '}') goto yy134;
	p = q;
	goto yy113;
yy134:
	++p;
	{
      eval->AddSpecial(StringPiece(start + 2, p - start - 3));
      continue;
    }
}

  }
  last_token_ = start;
  ofs_ = p;
  if (path)
    EatWhitespace();
  // Non-path strings end in newlines, so there's no whitespace to eat.
  return true;
}